

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::mark_satisfied_clauses_as_garbage(Internal *this)

{
  bool bVar1;
  iterator this_00;
  Clause *c_00;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *in_RDI;
  Clause *unaff_retaddr;
  Internal *in_stack_00000008;
  int tmp;
  Clause **c;
  iterator __end1;
  iterator __begin1;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *__range1;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_18;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *local_10;
  
  if ((long)in_RDI[0x7f].super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
            _M_impl.super__Vector_impl_data._M_start <
      (long)in_RDI[0xe3].super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
    in_RDI[0x7f].super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         in_RDI[0xe3].super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_10 = in_RDI + 0x5c;
    local_18._M_current =
         (Clause **)
         std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin(in_RDI);
    this_00 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end(in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                               *)in_RDI), bVar1) {
      c_00 = (Clause *)
             __gnu_cxx::
             __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
             ::operator*(&local_18);
      if ((*(uint *)&((Clause *)(c_00->field_0).id)->field_0x8 >> 4 & 1) == 0) {
        in_stack_ffffffffffffffd4 = clause_contains_fixed_literal(in_stack_00000008,unaff_retaddr);
        if (in_stack_ffffffffffffffd4 < 1) {
          if (in_stack_ffffffffffffffd4 < 0) {
            remove_falsified_literals((Internal *)c,(Clause *)in_stack_00000008);
          }
        }
        else {
          mark_garbage((Internal *)this_00._M_current,c_00);
        }
      }
      __gnu_cxx::
      __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
      ::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void Internal::mark_satisfied_clauses_as_garbage () {

  if (last.collect.fixed >= stats.all.fixed)
    return;
  last.collect.fixed = stats.all.fixed;

  LOG ("marking satisfied clauses and removing falsified literals");

  for (const auto &c : clauses) {
    if (c->garbage)
      continue;
    const int tmp = clause_contains_fixed_literal (c);
    if (tmp > 0)
      mark_garbage (c);
    else if (tmp < 0)
      remove_falsified_literals (c);
  }
}